

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

void u_enumCharNames_63(UChar32 start,UChar32 limit,UEnumCharNamesFn *fn,void *context,
                       UCharNameChoice nameChoice,UErrorCode *pErrorCode)

{
  UBool UVar1;
  int *piVar2;
  int local_44;
  uint32_t i;
  uint32_t *p;
  AlgorithmicRange *algRange;
  UErrorCode *pErrorCode_local;
  UCharNameChoice nameChoice_local;
  void *context_local;
  UEnumCharNamesFn *fn_local;
  UChar32 limit_local;
  UChar32 start_local;
  
  if ((pErrorCode != (UErrorCode *)0x0) && (UVar1 = U_FAILURE(*pErrorCode), UVar1 == '\0')) {
    if (((int)nameChoice < 4) && (fn != (UEnumCharNamesFn *)0x0)) {
      fn_local._0_4_ = limit;
      if (0x110000 < (uint)limit) {
        fn_local._0_4_ = 0x110000;
      }
      if (((uint)start < (uint)fn_local) &&
         (UVar1 = icu_63::isDataLoaded(pErrorCode), UVar1 != '\0')) {
        piVar2 = (int *)((long)&icu_63::uCharNames->tokenStringOffset +
                        (ulong)icu_63::uCharNames->algNamesOffset);
        p = (uint32_t *)(piVar2 + 1);
        fn_local._4_4_ = start;
        for (local_44 = *piVar2; local_44 != 0; local_44 = local_44 + -1) {
          if (fn_local._4_4_ < *p) {
            if ((uint)fn_local <= *p) {
              icu_63::enumNames(icu_63::uCharNames,fn_local._4_4_,(uint)fn_local,fn,context,
                                nameChoice);
              return;
            }
            UVar1 = icu_63::enumNames(icu_63::uCharNames,fn_local._4_4_,*p,fn,context,nameChoice);
            if (UVar1 == '\0') {
              return;
            }
            fn_local._4_4_ = *p;
          }
          if (fn_local._4_4_ <= p[1]) {
            if ((uint)fn_local <= p[1] + 1) {
              icu_63::enumAlgNames
                        ((AlgorithmicRange *)p,fn_local._4_4_,(uint)fn_local,fn,context,nameChoice);
              return;
            }
            UVar1 = icu_63::enumAlgNames
                              ((AlgorithmicRange *)p,fn_local._4_4_,p[1] + 1,fn,context,nameChoice);
            if (UVar1 == '\0') {
              return;
            }
            fn_local._4_4_ = p[1] + 1;
          }
          p = (uint32_t *)((long)p + (long)(int)(uint)*(ushort *)((long)p + 10));
        }
        icu_63::enumNames(icu_63::uCharNames,fn_local._4_4_,(uint)fn_local,fn,context,nameChoice);
      }
    }
    else {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_enumCharNames(UChar32 start, UChar32 limit,
                UEnumCharNamesFn *fn,
                void *context,
                UCharNameChoice nameChoice,
                UErrorCode *pErrorCode) {
    AlgorithmicRange *algRange;
    uint32_t *p;
    uint32_t i;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return;
    }

    if(nameChoice>=U_CHAR_NAME_CHOICE_COUNT || fn==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    if((uint32_t) limit > UCHAR_MAX_VALUE + 1) {
        limit = UCHAR_MAX_VALUE + 1;
    }
    if((uint32_t)start>=(uint32_t)limit) {
        return;
    }

    if(!isDataLoaded(pErrorCode)) {
        return;
    }

    /* interleave the data-driven ones with the algorithmic ones */
    /* iterate over all algorithmic ranges; assume that they are in ascending order */
    p=(uint32_t *)((uint8_t *)uCharNames+uCharNames->algNamesOffset);
    i=*p;
    algRange=(AlgorithmicRange *)(p+1);
    while(i>0) {
        /* enumerate the character names before the current algorithmic range */
        /* here: start<limit */
        if((uint32_t)start<algRange->start) {
            if((uint32_t)limit<=algRange->start) {
                enumNames(uCharNames, start, limit, fn, context, nameChoice);
                return;
            }
            if(!enumNames(uCharNames, start, (UChar32)algRange->start, fn, context, nameChoice)) {
                return;
            }
            start=(UChar32)algRange->start;
        }
        /* enumerate the character names in the current algorithmic range */
        /* here: algRange->start<=start<limit */
        if((uint32_t)start<=algRange->end) {
            if((uint32_t)limit<=(algRange->end+1)) {
                enumAlgNames(algRange, start, limit, fn, context, nameChoice);
                return;
            }
            if(!enumAlgNames(algRange, start, (UChar32)algRange->end+1, fn, context, nameChoice)) {
                return;
            }
            start=(UChar32)algRange->end+1;
        }
        /* continue to the next algorithmic range (here: start<limit) */
        algRange=(AlgorithmicRange *)((uint8_t *)algRange+algRange->size);
        --i;
    }
    /* enumerate the character names after the last algorithmic range */
    enumNames(uCharNames, start, limit, fn, context, nameChoice);
}